

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

size_t bitsToChunks(size_t chunkLenBits,uint8_t *input,size_t inputLen,uint16_t *chunks)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t j;
  size_t sVar4;
  int iVar5;
  
  if ((chunkLenBits != 0) && (chunkLenBits <= inputLen << 3)) {
    lVar3 = 0;
    uVar1 = (inputLen << 3) / chunkLenBits;
    uVar2 = 0;
    do {
      chunks[uVar2] = 0;
      sVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + ((input[lVar3 + sVar4 >> 3] >> (~(byte)(lVar3 + sVar4) & 7) & 1) <<
                        ((uint)sVar4 & 0x1f));
        chunks[uVar2] = (uint16_t)iVar5;
        sVar4 = sVar4 + 1;
      } while (chunkLenBits != sVar4);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + chunkLenBits;
    } while (uVar2 < uVar1);
    return uVar1;
  }
  return 0;
}

Assistant:

static size_t bitsToChunks(size_t chunkLenBits, const uint8_t* input, size_t inputLen,
                           uint16_t* chunks) {
  if (!chunkLenBits || chunkLenBits > inputLen * 8) {
    assert(!"Invalid input to bitsToChunks: not enough input");
    return 0;
  }
  size_t chunkCount = ((inputLen * 8) / chunkLenBits);

  for (size_t i = 0; i < chunkCount; i++) {
    chunks[i] = 0;
    for (size_t j = 0; j < chunkLenBits; j++) {
      chunks[i] += getBit(input, i * chunkLenBits + j) << j;
      assert(chunks[i] < (1 << chunkLenBits));
    }
  }

  return chunkCount;
}